

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readthis.cpp
# Opt level: O0

void __thiscall DReadThisMenu::Drawer(DReadThisMenu *this)

{
  DFrameBuffer *pDVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  FName *pFVar6;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_2c;
  double local_28;
  double alpha;
  FTexture *prevpic;
  FTexture *tex;
  DReadThisMenu *this_local;
  
  prevpic = (FTexture *)0x0;
  alpha = 0.0;
  tex = (FTexture *)this;
  if (::level.info != (level_info_t *)0x0) {
    sVar4 = FString::Len(&(::level.info)->F1Pic);
    if (sVar4 != 0) {
      pcVar5 = FString::operator_cast_to_char_(&(::level.info)->F1Pic);
      prevpic = FTextureManager::FindTexture(&TexMan,pcVar5,8,1);
      this->mScreen = 1;
    }
  }
  if (prevpic == (FTexture *)0x0) {
    pFVar6 = TArray<FName,_FName>::operator[](&gameinfo.infoPages,(long)(this->mScreen + -1));
    pcVar5 = FName::GetChars(pFVar6);
    prevpic = FTextureManager::operator[](&TexMan,pcVar5);
  }
  if (1 < this->mScreen) {
    pFVar6 = TArray<FName,_FName>::operator[](&gameinfo.infoPages,(long)(this->mScreen + -2));
    pcVar5 = FName::GetChars(pFVar6);
    alpha = (double)FTextureManager::operator[](&TexMan,pcVar5);
  }
  pDVar1 = screen;
  PalEntry::PalEntry((PalEntry *)&local_2c.field_0,0);
  uVar2 = DCanvas::GetWidth((DCanvas *)screen);
  uVar3 = DCanvas::GetHeight((DCanvas *)screen);
  (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
            (0x3f800000,pDVar1,(ulong)local_2c.d,0,0,(ulong)uVar2,(ulong)uVar3);
  local_28 = MIN<double>((double)(gametic - this->mInfoTic) * 0.08571428571428572,1.0);
  if ((local_28 < 1.0) && (alpha != 0.0)) {
    DCanvas::DrawTexture((DCanvas *)screen,(FTexture *)alpha,0.0,0.0,0x400013ae,1,0);
  }
  DCanvas::DrawTexture((DCanvas *)screen,prevpic,0.0,0.0,0x400013ae,local_28,1,0x4000138c,0);
  return;
}

Assistant:

void DReadThisMenu::Drawer()
{
	FTexture *tex = NULL, *prevpic = NULL;
	double alpha;

	// Did the mapper choose a custom help page via MAPINFO?
	if ((level.info != NULL) && level.info->F1Pic.Len() != 0)
	{
		tex = TexMan.FindTexture(level.info->F1Pic);
		mScreen = 1;
	}
	
	if (tex == NULL)
	{
		tex = TexMan[gameinfo.infoPages[mScreen-1].GetChars()];
	}

	if (mScreen > 1)
	{
		prevpic = TexMan[gameinfo.infoPages[mScreen-2].GetChars()];
	}

	screen->Dim(0, 1.0, 0,0, SCREENWIDTH, SCREENHEIGHT);
	alpha = MIN((gametic - mInfoTic) * (3. / TICRATE), 1.);
	if (alpha < 1. && prevpic != NULL)
	{
		screen->DrawTexture (prevpic, 0, 0, DTA_Fullscreen, true, TAG_DONE);
	}
	screen->DrawTexture (tex, 0, 0, DTA_Fullscreen, true, DTA_AlphaF, alpha,	TAG_DONE);

}